

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::RenderPassCreateInfo::addDependency
          (RenderPassCreateInfo *this,VkSubpassDependency dependency)

{
  iterator __position;
  pointer pVVar1;
  pointer pVVar2;
  VkSubpassDependency VVar3;
  __normal_iterator<vkt::Draw::SubpassDependency_*,_std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>_>
  __last;
  allocator_type local_39;
  SubpassDependency local_38;
  
  VVar3 = dependency;
  local_38.super_VkSubpassDependency.srcSubpass = dependency.srcSubpass;
  local_38.super_VkSubpassDependency.dstSubpass = dependency.dstSubpass;
  local_38.super_VkSubpassDependency.srcStageMask = VVar3.srcStageMask;
  local_38.super_VkSubpassDependency.dstStageMask = VVar3.dstStageMask;
  local_38.super_VkSubpassDependency.srcAccessMask = VVar3.srcAccessMask;
  local_38.super_VkSubpassDependency.dstAccessMask = VVar3.dstAccessMask;
  local_38.super_VkSubpassDependency.dependencyFlags = dependency.dependencyFlags;
  __position._M_current =
       (this->m_dependiences).
       super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_dependiences).
      super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::
    _M_realloc_insert<vkt::Draw::SubpassDependency>(&this->m_dependiences,__position,&local_38);
    __last._M_current =
         (this->m_dependiences).
         super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((__position._M_current)->super_VkSubpassDependency).dstStageMask = (int)VVar3._12_8_;
    ((__position._M_current)->super_VkSubpassDependency).srcAccessMask =
         (int)((ulong)VVar3._12_8_ >> 0x20);
    ((__position._M_current)->super_VkSubpassDependency).dstAccessMask = (int)VVar3._20_8_;
    ((__position._M_current)->super_VkSubpassDependency).dependencyFlags =
         (int)((ulong)VVar3._20_8_ >> 0x20);
    ((__position._M_current)->super_VkSubpassDependency).srcSubpass = dependency.srcSubpass;
    ((__position._M_current)->super_VkSubpassDependency).dstSubpass = dependency.dstSubpass;
    ((__position._M_current)->super_VkSubpassDependency).srcStageMask = dependency.srcStageMask;
    ((__position._M_current)->super_VkSubpassDependency).dstStageMask = dependency.dstStageMask;
    __last._M_current =
         (this->m_dependiences).
         super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_dependiences).
    super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>.
    _M_impl.super__Vector_impl_data._M_finish = __last._M_current;
  }
  std::vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDependency*,std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>>,void>
            ((vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>> *)&local_38,
             (this->m_dependiences).
             super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
             ._M_impl.super__Vector_impl_data._M_start,__last,&local_39);
  pVVar1 = (this->m_dependiencesStructs).
           super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->m_dependiencesStructs).
           super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_dependiencesStructs).
  super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_38.super_VkSubpassDependency._0_8_;
  (this->m_dependiencesStructs).
  super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_38.super_VkSubpassDependency.dstStageMask,
                         local_38.super_VkSubpassDependency.srcStageMask);
  (this->m_dependiencesStructs).
  super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_38.super_VkSubpassDependency.dstAccessMask,
                         local_38.super_VkSubpassDependency.srcAccessMask);
  local_38.super_VkSubpassDependency._0_8_ = (void *)0x0;
  local_38.super_VkSubpassDependency.srcStageMask = 0;
  local_38.super_VkSubpassDependency.dstStageMask = 0;
  local_38.super_VkSubpassDependency.srcAccessMask = 0;
  local_38.super_VkSubpassDependency.dstAccessMask = 0;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)pVVar2 - (long)pVVar1);
    if ((void *)local_38.super_VkSubpassDependency._0_8_ != (void *)0x0) {
      operator_delete((void *)local_38.super_VkSubpassDependency._0_8_,
                      CONCAT44(local_38.super_VkSubpassDependency.dstAccessMask,
                               local_38.super_VkSubpassDependency.srcAccessMask) -
                      local_38.super_VkSubpassDependency._0_8_);
    }
  }
  pVVar1 = (this->m_dependiencesStructs).
           super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->super_VkRenderPassCreateInfo).dependencyCount =
       (int)((ulong)((long)(this->m_dependiences).
                           super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_dependiences).
                          super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x49249249;
  (this->super_VkRenderPassCreateInfo).pDependencies = pVVar1;
  return;
}

Assistant:

void
RenderPassCreateInfo::addDependency (vk::VkSubpassDependency dependency)
{

	m_dependiences.push_back(dependency);
	m_dependiencesStructs	= std::vector<vk::VkSubpassDependency>(m_dependiences.begin(), m_dependiences.end());

	dependencyCount			= static_cast<deUint32>(m_dependiences.size());
	pDependencies			= &m_dependiencesStructs[0];
}